

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  uint uVar1;
  t_type *ptVar2;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  t_map *local_130;
  t_list *tlist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  t_map *local_e8;
  t_set *tset;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  t_map *local_40;
  t_map *tmap;
  allocator local_21;
  t_map *local_20;
  t_type *ttype_local;
  t_dart_generator *this_local;
  
  local_20 = (t_map *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_dart_generator *)__return_storage_ptr__;
  local_20 = (t_map *)t_generator::get_true_type(ttype);
  uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
          if ((uVar1 & 1) == 0) {
            get_ttype_class_name_abi_cxx11_(__return_storage_ptr__,this,(t_type *)local_20);
          }
          else {
            local_130 = local_20;
            ptVar2 = t_list::get_elem_type((t_list *)local_20);
            type_name_abi_cxx11_(&local_170,this,ptVar2);
            std::operator+(&local_150,"List<",&local_170);
            std::operator+(__return_storage_ptr__,&local_150,">");
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
          }
        }
        else {
          local_e8 = local_20;
          ptVar2 = t_set::get_elem_type((t_set *)local_20);
          type_name_abi_cxx11_((string *)&tlist,this,ptVar2);
          std::operator+(&local_108,"Set<",(string *)&tlist);
          std::operator+(__return_storage_ptr__,&local_108,">");
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&tlist);
        }
      }
      else {
        local_40 = local_20;
        ptVar2 = t_map::get_key_type(local_20);
        type_name_abi_cxx11_(&local_c0,this,ptVar2);
        std::operator+(&local_a0,"Map<",&local_c0);
        std::operator+(&local_80,&local_a0,", ");
        ptVar2 = t_map::get_val_type(local_40);
        type_name_abi_cxx11_((string *)&tset,this,ptVar2);
        std::operator+(&local_60,&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tset);
        std::operator+(__return_storage_ptr__,&local_60,">");
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&tset);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
    }
  }
  else {
    base_type_name_abi_cxx11_(__return_storage_ptr__,this,(t_base_type *)local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::type_name(t_type* ttype) {
  ttype = get_true_type(ttype);

  if (ttype->is_base_type()) {
    return base_type_name((t_base_type*)ttype);
  } else if (ttype->is_enum()) {
    return "int";
  } else if (ttype->is_map()) {
    t_map* tmap = (t_map*)ttype;
    return "Map<" + type_name(tmap->get_key_type()) + ", "
                  + type_name(tmap->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set* tset = (t_set*)ttype;
    return "Set<" + type_name(tset->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list* tlist = (t_list*)ttype;
    return "List<" + type_name(tlist->get_elem_type()) + ">";
  }

  return get_ttype_class_name(ttype);
}